

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::Run(Thread *this,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult result;
  int kDefaultInstructionCount;
  Ptr *out_trap_local;
  Thread *this_local;
  
  do {
    RVar1 = Run(this,1000,out_trap);
  } while (RVar1 == Ok);
  return RVar1;
}

Assistant:

RunResult Thread::Run(Trap::Ptr* out_trap) {
  const int kDefaultInstructionCount = 1000;
  RunResult result;
  do {
    result = Run(kDefaultInstructionCount, out_trap);
  } while (result == RunResult::Ok);
  return result;
}